

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_floor_l_s_mipsel(CPUMIPSState_conflict4 *env,uint32_t fst0)

{
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\x01';
  uVar1 = float32_to_int64_mipsel(fst0,&(env->active_fpu).fp_status);
  (env->active_fpu).fp_status.float_rounding_mode =
       (char)ieee_rm_mipsel[(env->active_fpu).fcr31 & 3];
  if (((env->active_fpu).fp_status.float_exception_flags & 9) != 0) {
    uVar1 = 0x7fffffffffffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint64_t helper_float_floor_l_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_down, &env->active_fpu.fp_status);
    dt2 = float32_to_int64(fst0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        dt2 = FP_TO_INT64_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return dt2;
}